

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::Matchers::Impl::StdString::StartsWith::match(StartsWith *this,string *expr)

{
  bool bVar1;
  string local_30;
  
  CasedString::adjustString(&local_30,&this->m_data,expr);
  bVar1 = startsWith(&local_30,&(this->m_data).m_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

virtual bool match( std::string const& expr ) const {
                return startsWith( m_data.adjustString( expr ), m_data.m_str );
            }